

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void primary(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  Token *pTVar3;
  Scanner *pSVar4;
  char **ppcVar5;
  uint uVar6;
  size_t sVar7;
  CallFrame *pCVar8;
  double value;
  long lVar9;
  HTItemKey key;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar10;
  undefined8 uVar11;
  object_t *poVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 instruction;
  ValueType VVar16;
  uint32_t uVar17;
  ulong uVar18;
  ObjString *object;
  TokenType TVar19;
  char *pcVar20;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar21;
  size_t sVar22;
  char *__nptr;
  Vm *pVVar23;
  char cVar24;
  CodeBuffer *code_buffer;
  CallFrame ***pppCVar25;
  uint8_t index_1;
  uint8_t uVar26;
  undefined1 auVar27 [16];
  Variable VVar28;
  CrispyValue CVar29;
  CrispyValue value_00;
  CrispyValue value_01;
  code *pcStack_70;
  undefined1 auStack_68 [16];
  char *pcStack_58;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 local_50;
  CrispyValue CStack_48;
  Vm *local_38;
  
  pVVar23 = (Vm *)auStack_68;
  pCVar1 = &vm->compiler;
  TVar19 = (vm->compiler).token.type;
  if ((int)TVar19 < 0x16) {
    switch(TVar19) {
    case TOKEN_OPEN_PAREN:
      TVar19 = (pCVar1->token).type;
      uVar15 = *(undefined4 *)&(pCVar1->token).field_0x4;
      pcVar20 = (vm->compiler).token.start;
      uVar17 = (vm->compiler).token.line;
      uVar14 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
      (vm->compiler).previous.length = (vm->compiler).token.length;
      (vm->compiler).previous.line = uVar17;
      *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar14;
      (vm->compiler).previous.type = TVar19;
      *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar15;
      (vm->compiler).previous.start = pcVar20;
      uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x4;
      pcVar20 = (vm->compiler).next.start;
      sVar22 = (vm->compiler).next.length;
      uVar17 = (vm->compiler).next.line;
      uVar15 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
      (pCVar1->token).type = (vm->compiler).next.type;
      *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
      (vm->compiler).token.start = pcVar20;
      (vm->compiler).token.length = sVar22;
      (vm->compiler).token.line = uVar17;
      *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
      pcStack_70 = (code *)0x106500;
      scan_token((Token *)(auStack_68 + 8),&(vm->compiler).scanner);
      (vm->compiler).next.length = (size_t)local_50;
      (vm->compiler).next.line = CStack_48.type;
      *(undefined4 *)&(vm->compiler).next.field_0x1c = CStack_48._4_4_;
      *(undefined8 *)&(vm->compiler).next = auStack_68._8_8_;
      (vm->compiler).next.start = pcStack_58;
      pcStack_70 = (code *)0x106523;
      expr(vm);
      if ((vm->compiler).token.type == TOKEN_CLOSE_PAREN) goto LAB_00106d0c;
      uVar6 = (vm->compiler).scope[(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].
              cap;
      pcVar20 = "Expected \')\'";
      goto LAB_00106d97;
    case TOKEN_DEC_NUMBER:
      sVar7 = (vm->compiler).token.length;
      if (sVar7 == 1) {
        cVar24 = *(vm->compiler).token.start;
        if (cVar24 == '1') {
          code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
          uVar26 = '\x15';
        }
        else {
          if (cVar24 != '0') goto LAB_00106a8e;
          code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
          uVar26 = '\x14';
        }
        goto LAB_00106d07;
      }
LAB_00106a8e:
      lVar9 = -(sVar7 + 0x10 & 0xfffffffffffffff0);
      __nptr = auStack_68 + lVar9;
      pcVar20 = (vm->compiler).token.start;
      local_38 = (Vm *)auStack_68;
      *(undefined8 *)(auStack_68 + lVar9 + -8) = 0x106ab5;
      memcpy(__nptr,pcVar20,sVar7);
      __nptr[sVar7] = '\0';
      *(undefined8 *)(auStack_68 + lVar9 + -8) = 0x106ac4;
      value = strtod(__nptr,(char **)0x0);
      break;
    case TOKEN_HEX_NUMBER:
      sVar7 = (vm->compiler).token.length;
      lVar9 = -(sVar7 + 0x10 & 0xfffffffffffffff0);
      __nptr = auStack_68 + lVar9;
      pcVar20 = (vm->compiler).token.start;
      local_38 = (Vm *)auStack_68;
      *(undefined8 *)(auStack_68 + lVar9 + -8) = 0x1068e2;
      memcpy(__nptr,pcVar20,sVar7);
      __nptr[sVar7] = '\0';
      *(undefined8 *)(auStack_68 + lVar9 + -8) = 0x1068f6;
      uVar18 = strtoul(__nptr,(char **)0x0,0x10);
      auVar27._8_4_ = (int)(uVar18 >> 0x20);
      auVar27._0_8_ = uVar18;
      auVar27._12_4_ = 0x45300000;
      value = (auVar27._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0);
      break;
    case TOKEN_STRING:
      pcStack_70 = (code *)0x106977;
      string(vm,true);
      pVVar23 = (Vm *)auStack_68;
      goto LAB_00106d0c;
    default:
      if (TVar19 == TOKEN_IDENTIFIER) {
        pcStack_70 = (code *)0x10672b;
        VVar28 = resolve_var(vm,(vm->compiler).token.start,(vm->compiler).token.length);
        uVar26 = (uint8_t)VVar28.index;
        if (vm->frame_count == VVar28.frame_offset) {
          pcStack_70 = (code *)0x106761;
          write_code_buffer(&(vm->frames).frame_pointers[VVar28.frame_offset - 1]->code_buffer,
                            '\x17');
          pcStack_70 = (code *)0x106785;
          CStack_48.field_1.p_value = VVar28._0_8_;
          write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,uVar26);
          TVar19 = (pCVar1->token).type;
          uVar15 = *(undefined4 *)&(pCVar1->token).field_0x4;
          pcVar20 = (vm->compiler).token.start;
          uVar17 = (vm->compiler).token.line;
          uVar14 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
          (vm->compiler).previous.length = (vm->compiler).token.length;
          (vm->compiler).previous.line = uVar17;
          *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar14;
          (vm->compiler).previous.type = TVar19;
          *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar15;
          (vm->compiler).previous.start = pcVar20;
          uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x4;
          pcVar20 = (vm->compiler).next.start;
          sVar22 = (vm->compiler).next.length;
          uVar17 = (vm->compiler).next.line;
          uVar15 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          (pCVar1->token).type = (vm->compiler).next.type;
          *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
          (vm->compiler).token.start = pcVar20;
          (vm->compiler).token.length = sVar22;
          (vm->compiler).token.line = uVar17;
          *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
          pSVar4 = &(vm->compiler).scanner;
          pcStack_70 = (code *)0x1067cd;
          local_38 = (Vm *)pCVar1;
          scan_token((Token *)(auStack_68 + 8),pSVar4);
          pVVar23 = local_38;
          (vm->compiler).next.length = (size_t)local_50;
          (vm->compiler).next.line = CStack_48.type;
          *(undefined4 *)&(vm->compiler).next.field_0x1c = CStack_48._4_4_;
          *(undefined8 *)&(vm->compiler).next = auStack_68._8_8_;
          (vm->compiler).next.start = pcStack_58;
          TVar19 = (vm->compiler).token.type;
          if ((TVar19 != TOKEN_MINUS_MINUS) && (TVar19 != TOKEN_PLUS_PLUS)) {
            return;
          }
          pTVar2 = &(vm->compiler).next;
          VVar16 = local_38->stack[0].type;
          uVar14 = *(undefined4 *)&local_38->stack[0].field_0x4;
          aVar21 = local_38->stack[0].field_1;
          aVar10 = local_38->stack[1].field_1;
          (vm->compiler).previous.length = *(size_t *)(local_38->stack + 1);
          *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)&(vm->compiler).previous.line = aVar10;
          (vm->compiler).previous.type = VVar16;
          *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar14;
          (vm->compiler).previous.start = (char *)aVar21;
          uVar14 = *(undefined4 *)&pTVar2->field_0x4;
          aVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)(vm->compiler).next.start;
          sVar22 = (vm->compiler).next.length;
          aVar10 = *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)&(vm->compiler).next.line;
          local_38->stack[0].type = pTVar2->type;
          *(undefined4 *)&local_38->stack[0].field_0x4 = uVar14;
          local_38->stack[0].field_1 = aVar21;
          *(size_t *)(local_38->stack + 1) = sVar22;
          local_38->stack[1].field_1 = aVar10;
          pcStack_70 = (code *)0x10683e;
          scan_token((Token *)(auStack_68 + 8),pSVar4);
          (vm->compiler).next.length = (size_t)local_50;
          (vm->compiler).next.line = CStack_48.type;
          *(undefined4 *)&(vm->compiler).next.field_0x1c = CStack_48._4_4_;
          *(undefined8 *)pTVar2 = auStack_68._8_8_;
          (vm->compiler).next.start = pcStack_58;
          if (((undefined1  [16])VVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcStack_70 = (code *)0x10688f;
            write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                              ((vm->compiler).previous.type != TOKEN_PLUS_PLUS) + '/');
            pcStack_70 = (code *)0x1068af;
            write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                              CStack_48.field_1.p_value._0_1_);
            return;
          }
          cVar24 = -0x11;
          pcStack_70 = string;
          error((Compiler *)pVVar23,"Cannot increment value");
          ppcVar5 = &(pVVar23->compiler).token.start;
          key = *(HTItemKey *)ppcVar5;
          pcStack_70 = (code *)&stack0xfffffffffffffff8;
          CVar29 = ht_get(&pVVar23->strings,*(HTItemKey *)ppcVar5);
          if (CVar29.type == NIL) {
            pcVar20 = (pVVar23->compiler).token.start;
            if (cVar24 == '\0') {
              sVar22 = (pVVar23->compiler).token.length;
            }
            else {
              pcVar20 = pcVar20 + 1;
              sVar22 = (pVVar23->compiler).token.length - 2;
            }
            object = new_string(pVVar23,pcVar20,sVar22);
            CVar29 = create_object(&object->object);
            aVar21 = CVar29.field_1;
            VVar16 = CVar29.type;
            CVar29._4_4_ = 0;
            CVar29.type = VVar16;
            CVar29.field_1.p_value = aVar21.p_value;
            ht_put(&pVVar23->strings,key,CVar29);
          }
          else {
            CVar29 = create_object(CVar29.field_1.o_value);
            aVar21 = CVar29.field_1;
            VVar16 = CVar29.type;
          }
          value_01._4_4_ = 0;
          value_01.type = VVar16;
          value_01.field_1.p_value = aVar21.p_value;
          uVar17 = add_constant(pVVar23,value_01);
          if ((uVar17 & 0xff00) == 0) {
            uVar26 = '\x12';
          }
          else {
            uVar26 = (uint8_t)(uVar17 >> 8);
            write_code_buffer(&(pVVar23->frames).frame_pointers[pVVar23->frame_count - 1]->
                               code_buffer,'\x13');
          }
          pppCVar25 = &(pVVar23->frames).frame_pointers;
          write_code_buffer(&(*pppCVar25)[pVVar23->frame_count - 1]->code_buffer,uVar26);
          write_code_buffer(&(*pppCVar25)[pVVar23->frame_count - 1]->code_buffer,(uint8_t)uVar17);
          return;
        }
        pcStack_70 = (code *)0x106b9d;
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x18');
        pcStack_70 = (code *)0x106bc5;
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                          (uint8_t)VVar28.frame_offset);
        code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
        goto LAB_00106d07;
      }
    case TOKEN_CLOSE_PAREN:
switchD_001064bd_caseD_1:
      uVar6 = (vm->compiler).scope[(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].
              cap;
      pcVar20 = "Unexpected Token";
LAB_00106d97:
      pcStack_70 = (code *)0x106d9e;
      printf("[Line %d] %s\n",(ulong)uVar6,pcVar20);
      pcStack_70 = (code *)0x106daf;
      longjmp((__jmp_buf_tag *)error_buf,2);
    }
    __nptr[-8] = -0x37;
    __nptr[-7] = 'j';
    __nptr[-6] = '\x10';
    __nptr[-5] = '\0';
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    CVar29 = create_number(value);
    value_00.field_1 = CVar29.field_1;
    value_00._4_4_ = 0;
    value_00.type = CVar29.type;
    __nptr[-8] = -0x2d;
    __nptr[-7] = 'j';
    __nptr[-6] = '\x10';
    __nptr[-5] = '\0';
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    CStack_48.field_1.p_value._0_4_ = add_constant(vm,value_00);
    if ((CStack_48.field_1.p_value._0_4_ & 0xff00) == 0) {
      uVar26 = '\x12';
    }
    else {
      uVar26 = (uint8_t)((uint)CStack_48.field_1.p_value._0_4_ >> 8);
      pCVar8 = (vm->frames).frame_pointers[vm->frame_count - 1];
      builtin_strncpy(__nptr + -8,"\x13k\x10",4);
      __nptr[-4] = '\0';
      __nptr[-3] = '\0';
      __nptr[-2] = '\0';
      __nptr[-1] = '\0';
      write_code_buffer(&pCVar8->code_buffer,'\x13');
    }
    pppCVar25 = &(vm->frames).frame_pointers;
    pCVar8 = (*pppCVar25)[vm->frame_count - 1];
    builtin_strncpy(__nptr + -8,"Ak\x10",4);
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    write_code_buffer(&pCVar8->code_buffer,uVar26);
    pCVar8 = (*pppCVar25)[vm->frame_count - 1];
    instruction = CStack_48.field_1.p_value._0_1_;
    builtin_strncpy(__nptr + -8,"\\k\x10",4);
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    write_code_buffer(&pCVar8->code_buffer,instruction);
    pVVar23 = local_38;
  }
  else {
    if ((int)TVar19 < 0x1f) {
      if (TVar19 == TOKEN_OPEN_BRACE) {
        TVar19 = (pCVar1->token).type;
        uVar15 = *(undefined4 *)&(pCVar1->token).field_0x4;
        pcVar20 = (vm->compiler).token.start;
        uVar17 = (vm->compiler).token.line;
        uVar14 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
        (vm->compiler).previous.length = (vm->compiler).token.length;
        (vm->compiler).previous.line = uVar17;
        *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar14;
        (vm->compiler).previous.type = TVar19;
        *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar15;
        (vm->compiler).previous.start = pcVar20;
        uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x4;
        pcVar20 = (vm->compiler).next.start;
        sVar22 = (vm->compiler).next.length;
        uVar17 = (vm->compiler).next.line;
        uVar15 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
        (pCVar1->token).type = (vm->compiler).next.type;
        *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
        (vm->compiler).token.start = pcVar20;
        (vm->compiler).token.length = sVar22;
        (vm->compiler).token.line = uVar17;
        *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
        pSVar4 = &(vm->compiler).scanner;
        pcStack_70 = (code *)0x1069c6;
        scan_token((Token *)(auStack_68 + 8),pSVar4);
        (vm->compiler).next.length = (size_t)local_50;
        (vm->compiler).next.line = CStack_48.type;
        *(undefined4 *)&(vm->compiler).next.field_0x1c = CStack_48._4_4_;
        *(undefined8 *)&(vm->compiler).next = auStack_68._8_8_;
        (vm->compiler).next.start = pcStack_58;
        if (((vm->compiler).next.type != TOKEN_COLON) && ((pCVar1->token).type != TOKEN_CLOSE_BRACE)
           ) {
          return;
        }
        pcStack_70 = (code *)0x106a1e;
        local_38 = vm;
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,' ');
        pVVar23 = local_38;
        TVar19 = (vm->compiler).token.type;
        if ((TVar19 != TOKEN_CLOSE_BRACE) && (TVar19 != TOKEN_EOF)) {
          aVar21.o_value = (Object *)&(local_38->compiler).previous;
          pTVar2 = &(local_38->compiler).next;
          CStack_48.field_1 = aVar21;
          while( true ) {
            pcStack_70 = (code *)0x106c0e;
            string(pVVar23,true);
            uVar11 = *(undefined8 *)&pCVar1->token;
            poVar12 = (object_t *)(vm->compiler).token.start;
            uVar13 = *(undefined8 *)&(vm->compiler).token.line;
            *(size_t *)(aVar21.p_value + 0x10) = (vm->compiler).token.length;
            *(undefined8 *)(aVar21.p_value + 0x18) = uVar13;
            *(uint8_t *)aVar21 = (char)uVar11;
            *(int3 *)((long)aVar21 + 1) = (int3)((ulong)uVar11 >> 8);
            *(int *)((long)aVar21 + 4) = (int)((ulong)uVar11 >> 0x20);
            (aVar21.o_value)->next = poVar12;
            uVar14 = *(undefined4 *)&pTVar2->field_0x4;
            pcVar20 = (pVVar23->compiler).next.start;
            sVar22 = (pVVar23->compiler).next.length;
            uVar17 = (pVVar23->compiler).next.line;
            uVar15 = *(undefined4 *)&(pVVar23->compiler).next.field_0x1c;
            (pCVar1->token).type = pTVar2->type;
            *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
            (vm->compiler).token.start = pcVar20;
            (vm->compiler).token.length = sVar22;
            (vm->compiler).token.line = uVar17;
            *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
            pcStack_70 = (code *)0x106c3f;
            scan_token((Token *)(auStack_68 + 8),pSVar4);
            (pVVar23->compiler).next.length = (size_t)local_50;
            (pVVar23->compiler).next.line = CStack_48.type;
            *(undefined4 *)&(pVVar23->compiler).next.field_0x1c = CStack_48._4_4_;
            *(undefined8 *)pTVar2 = auStack_68._8_8_;
            (pVVar23->compiler).next.start = pcStack_58;
            pcStack_70 = (code *)0x106c69;
            consume((Token *)(auStack_68 + 8),pVVar23,TOKEN_COLON,
                    "Expected \':\' between key and value in dictionary");
            pcStack_70 = (code *)0x106c71;
            expr(pVVar23);
            pcStack_70 = (code *)0x106c93;
            write_code_buffer(&(pVVar23->frames).frame_pointers[pVVar23->frame_count - 1]->
                               code_buffer,'#');
            aVar21 = CStack_48.field_1;
            if ((pVVar23->compiler).token.type != TOKEN_COMMA) break;
            uVar11 = *(undefined8 *)&pCVar1->token;
            poVar12 = (object_t *)(vm->compiler).token.start;
            uVar13 = *(undefined8 *)&(vm->compiler).token.line;
            *(size_t *)(CStack_48.field_1.p_value + 0x10) = (vm->compiler).token.length;
            *(undefined8 *)(CStack_48.field_1.p_value + 0x18) = uVar13;
            (CStack_48.field_1.o_value)->marked = (char)uVar11;
            *(int3 *)&((Object *)CStack_48.field_1.p_value)->field_0x1 = (int3)((ulong)uVar11 >> 8);
            (CStack_48.field_1.o_value)->type = (int)((ulong)uVar11 >> 0x20);
            (CStack_48.field_1.o_value)->next = poVar12;
            uVar14 = *(undefined4 *)&pTVar2->field_0x4;
            pcVar20 = (pVVar23->compiler).next.start;
            sVar22 = (pVVar23->compiler).next.length;
            uVar17 = (pVVar23->compiler).next.line;
            uVar15 = *(undefined4 *)&(pVVar23->compiler).next.field_0x1c;
            (pCVar1->token).type = pTVar2->type;
            *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
            (vm->compiler).token.start = pcVar20;
            (vm->compiler).token.length = sVar22;
            (vm->compiler).token.line = uVar17;
            *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
            pcStack_70 = (code *)0x106cd3;
            scan_token((Token *)(auStack_68 + 8),pSVar4);
            (pVVar23->compiler).next.length = (size_t)local_50;
            (pVVar23->compiler).next.line = CStack_48.type;
            *(undefined4 *)&(pVVar23->compiler).next.field_0x1c = CStack_48._4_4_;
            *(undefined8 *)pTVar2 = auStack_68._8_8_;
            (pVVar23->compiler).next.start = pcStack_58;
          }
        }
        pcVar20 = "Expected \'}\' after dictionary literal";
        TVar19 = TOKEN_CLOSE_BRACE;
        vm = local_38;
LAB_00106b78:
        pcStack_70 = (code *)0x106b7d;
        consume((Token *)(auStack_68 + 8),vm,TVar19,pcVar20);
        return;
      }
      if (TVar19 != TOKEN_TRUE) goto switchD_001064bd_caseD_1;
      code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
      uVar26 = '\x01';
    }
    else if (TVar19 == TOKEN_FALSE) {
      code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
      uVar26 = '\x02';
    }
    else {
      if (TVar19 != TOKEN_NIL) {
        if (TVar19 == TOKEN_OPEN_BRACKET) {
          pcStack_70 = (code *)0x10659f;
          write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'!');
          pTVar2 = &(vm->compiler).previous;
          TVar19 = (pCVar1->token).type;
          uVar15 = *(undefined4 *)&(pCVar1->token).field_0x4;
          pcVar20 = (vm->compiler).token.start;
          uVar17 = (vm->compiler).token.line;
          uVar14 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
          (vm->compiler).previous.length = (vm->compiler).token.length;
          (vm->compiler).previous.line = uVar17;
          *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar14;
          (vm->compiler).previous.type = TVar19;
          *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar15;
          (vm->compiler).previous.start = pcVar20;
          pTVar3 = &(vm->compiler).next;
          uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x4;
          pcVar20 = (vm->compiler).next.start;
          sVar22 = (vm->compiler).next.length;
          uVar17 = (vm->compiler).next.line;
          uVar15 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          (pCVar1->token).type = (vm->compiler).next.type;
          *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
          (vm->compiler).token.start = pcVar20;
          (vm->compiler).token.length = sVar22;
          (vm->compiler).token.line = uVar17;
          *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
          pSVar4 = &(vm->compiler).scanner;
          pcStack_70 = (code *)0x1065ee;
          scan_token((Token *)(auStack_68 + 8),pSVar4);
          (vm->compiler).next.length = (size_t)local_50;
          (vm->compiler).next.line = CStack_48.type;
          *(undefined4 *)&(vm->compiler).next.field_0x1c = CStack_48._4_4_;
          *(undefined8 *)&(vm->compiler).next = auStack_68._8_8_;
          (vm->compiler).next.start = pcStack_58;
          if ((vm->compiler).token.type == TOKEN_CLOSE_BRACKET) {
            TVar19 = (pCVar1->token).type;
            uVar15 = *(undefined4 *)&(pCVar1->token).field_0x4;
            pcVar20 = (vm->compiler).token.start;
            uVar17 = (vm->compiler).token.line;
            uVar14 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
            (vm->compiler).previous.length = (vm->compiler).token.length;
            (vm->compiler).previous.line = uVar17;
            *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar14;
            pTVar2->type = TVar19;
            *(undefined4 *)&pTVar2->field_0x4 = uVar15;
            (vm->compiler).previous.start = pcVar20;
            uVar14 = *(undefined4 *)&pTVar3->field_0x4;
            pcVar20 = (vm->compiler).next.start;
            sVar22 = (vm->compiler).next.length;
            uVar17 = (vm->compiler).next.line;
            uVar15 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
            (pCVar1->token).type = pTVar3->type;
            *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
            (vm->compiler).token.start = pcVar20;
            (vm->compiler).token.length = sVar22;
            (vm->compiler).token.line = uVar17;
            *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
            pcStack_70 = (code *)0x106646;
            scan_token((Token *)(auStack_68 + 8),pSVar4);
            (vm->compiler).next.length = (size_t)local_50;
            (vm->compiler).next.line = CStack_48.type;
            *(undefined4 *)&(vm->compiler).next.field_0x1c = CStack_48._4_4_;
            *(undefined8 *)pTVar3 = auStack_68._8_8_;
            (vm->compiler).next.start = pcStack_58;
            return;
          }
          while( true ) {
            pcStack_70 = (code *)0x106664;
            expr(vm);
            pcStack_70 = (code *)0x106685;
            write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\"');
            if ((vm->compiler).token.type != TOKEN_COMMA) break;
            TVar19 = (pCVar1->token).type;
            uVar15 = *(undefined4 *)&(pCVar1->token).field_0x4;
            pcVar20 = (vm->compiler).token.start;
            uVar17 = (vm->compiler).token.line;
            uVar14 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
            (vm->compiler).previous.length = (vm->compiler).token.length;
            (vm->compiler).previous.line = uVar17;
            *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar14;
            pTVar2->type = TVar19;
            *(undefined4 *)&pTVar2->field_0x4 = uVar15;
            (vm->compiler).previous.start = pcVar20;
            uVar14 = *(undefined4 *)&pTVar3->field_0x4;
            pcVar20 = (vm->compiler).next.start;
            sVar22 = (vm->compiler).next.length;
            uVar17 = (vm->compiler).next.line;
            uVar15 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
            (pCVar1->token).type = pTVar3->type;
            *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
            (vm->compiler).token.start = pcVar20;
            (vm->compiler).token.length = sVar22;
            (vm->compiler).token.line = uVar17;
            *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
            pcStack_70 = (code *)0x1066c5;
            scan_token((Token *)(auStack_68 + 8),pSVar4);
            (vm->compiler).next.length = (size_t)local_50;
            (vm->compiler).next.line = CStack_48.type;
            *(undefined4 *)&(vm->compiler).next.field_0x1c = CStack_48._4_4_;
            *(undefined8 *)pTVar3 = auStack_68._8_8_;
            (vm->compiler).next.start = pcStack_58;
          }
          pcVar20 = "Expected \']\' after list literal";
          TVar19 = TOKEN_CLOSE_BRACKET;
          goto LAB_00106b78;
        }
        goto switchD_001064bd_caseD_1;
      }
      code_buffer = &(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer;
      uVar26 = '\x03';
    }
LAB_00106d07:
    pcStack_70 = (code *)0x106d0c;
    write_code_buffer(code_buffer,uVar26);
    pVVar23 = (Vm *)auStack_68;
  }
LAB_00106d0c:
  TVar19 = (pCVar1->token).type;
  uVar15 = *(undefined4 *)&(pCVar1->token).field_0x4;
  pcVar20 = (vm->compiler).token.start;
  uVar17 = (vm->compiler).token.line;
  uVar14 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
  (vm->compiler).previous.length = (vm->compiler).token.length;
  (vm->compiler).previous.line = uVar17;
  *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar14;
  (vm->compiler).previous.type = TVar19;
  *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar15;
  (vm->compiler).previous.start = pcVar20;
  uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x4;
  pcVar20 = (vm->compiler).next.start;
  sVar22 = (vm->compiler).next.length;
  uVar17 = (vm->compiler).next.line;
  uVar15 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
  (pCVar1->token).type = (vm->compiler).next.type;
  *(undefined4 *)&(pCVar1->token).field_0x4 = uVar14;
  (vm->compiler).token.start = pcVar20;
  (vm->compiler).token.length = sVar22;
  (vm->compiler).token.line = uVar17;
  *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar15;
  pVVar23[-1].interactive = true;
  pVVar23[-1].err_flag = true;
  *(undefined2 *)&pVVar23[-1].field_0x2102 = 0x10;
  pVVar23[-1].current_status = VM_STATUS_INIT;
  scan_token((Token *)(auStack_68 + 8),&(vm->compiler).scanner);
  (vm->compiler).next.length = (size_t)local_50;
  (vm->compiler).next.line = CStack_48.type;
  *(undefined4 *)&(vm->compiler).next.field_0x1c = CStack_48._4_4_;
  *(undefined8 *)&(vm->compiler).next = auStack_68._8_8_;
  (vm->compiler).next.start = pcStack_58;
  return;
}

Assistant:

static void primary(Vm *vm) {
    Compiler *compiler = &vm->compiler;

    switch (compiler->token.type) {
        case TOKEN_DEC_NUMBER: {
            Token token = compiler->token;
            if (token.length == 1) {
                if (*token.start == '0') {
                    emit_no_arg(vm, OP_LDC_0);
                    break;
                } else if (*compiler->token.start == '1') {
                    emit_no_arg(vm, OP_LDC_1);
                    break;
                }
            }

            size_t length = compiler->token.length;
            char str[length + 1];
            memcpy(str, compiler->token.start, length);
            str[length] = '\0';
            double res;

            res = strtod(str, NULL);
            uint16_t pos = (uint16_t) add_constant(vm, create_number(res));

            if (pos > 255) {
                uint8_t index_1 = (uint8_t) (pos >> 8);
                uint8_t index_2 = (uint8_t) (pos & 0xFF);
                emit_short_arg(vm, OP_LDC_W, index_1, index_2);
            } else {
                emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
            }

            break;
        }
        case TOKEN_HEX_NUMBER: {
            size_t length = compiler->token.length;
            char str[length + 1];
            memcpy(str, compiler->token.start, length);
            str[length] = '\0';
            uint64_t res;

            res = strtoul(str, NULL, 16);
            uint16_t pos = (uint16_t) add_constant(vm, create_number(res));

            if (pos > 255) {
                uint8_t index_1 = (uint8_t) (pos >> 8);
                uint8_t index_2 = (uint8_t) (pos & 0xFF);
                emit_short_arg(vm, OP_LDC_W, index_1, index_2);
            } else {
                emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
            }

            break;
        }
        case TOKEN_OPEN_PAREN: {
            advance(vm);
            expr(vm);
            if (vm->compiler.token.type != TOKEN_CLOSE_PAREN) {
                error(&vm->compiler, "Expected ')'");
            }
            break;
        }
        case TOKEN_IDENTIFIER: {
            Variable var = resolve_var(vm, compiler->token.start, compiler->token.length);
            if (var.frame_offset != vm->frame_count) {
                // TODO bigger numbers
                emit_short_arg(vm, OP_LOAD_OFFSET, (uint8_t) var.frame_offset, (uint8_t) var.index);
                break;
            }
            emit_byte_arg(vm, OP_LOAD, (uint8_t) var.index);

            advance(vm);

            if (compiler->token.type == TOKEN_PLUS_PLUS || compiler->token.type == TOKEN_MINUS_MINUS) {
                advance(vm);

                if (!var.assignable) {
                    error(compiler, "Cannot increment value");
                }

                // TODO bigger numbers
                emit_byte_arg(vm, compiler->previous.type == TOKEN_PLUS_PLUS ? OP_INC_1 : OP_DEC_1,
                              (uint8_t) var.index);
            }

            // already advanced
            return;
        }
        case TOKEN_OPEN_BRACKET: {
            emit_no_arg(vm, OP_LIST_NEW);
            advance(vm);

            if (!match(vm, TOKEN_CLOSE_BRACKET)) {
                do {
                    expr(vm);
                    emit_no_arg(vm, OP_LIST_APPEND);
                } while (match(vm, TOKEN_COMMA));

                consume(vm, TOKEN_CLOSE_BRACKET, "Expected ']' after list literal");
            }
            return;
        }
        case TOKEN_OPEN_BRACE: {
            advance(vm);
            // a dictionary, not a block
            if (compiler->next.type == TOKEN_COLON || compiler->token.type == TOKEN_CLOSE_BRACE) {
                emit_no_arg(vm, OP_DICT_NEW);

                if (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
                    do {
                        // consume key
                        string(vm, true);
                        advance(vm);
                        consume(vm, TOKEN_COLON, "Expected ':' between key and value in dictionary");
                        // consume value
                        expr(vm);

                        emit_no_arg(vm, OP_STRUCT_SET);
                    } while (match(vm, TOKEN_COMMA));
                }

                consume(vm, TOKEN_CLOSE_BRACE, "Expected '}' after dictionary literal");
            }

            return;
        }
        case TOKEN_STRING: {
            string(vm, true);
            break;
        }
        case TOKEN_FALSE:
            emit_no_arg(vm, OP_FALSE);
            break;
        case TOKEN_TRUE:
            emit_no_arg(vm, OP_TRUE);
            break;
        case TOKEN_NIL:
            emit_no_arg(vm, OP_NIL);
            break;
        default:
            error(&vm->compiler, "Unexpected Token");
            break;
    }

    advance(vm);
}